

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marry.c
# Opt level: O0

void nuts_scratch_addr(char *scheme,size_t sz,char *addr)

{
  uint16_t uVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  char *pcVar7;
  char *pcVar8;
  char *local_40;
  char *tmpdir;
  char *ip_1;
  char *ip;
  char *addr_local;
  size_t sz_local;
  char *scheme_local;
  
  iVar2 = strcmp(scheme,"inproc");
  if ((iVar2 == 0) || (iVar2 = strcmp(scheme,"abstract"), iVar2 == 0)) {
    uVar3 = nng_random();
    uVar4 = nng_random();
    uVar5 = nng_random();
    uVar6 = nng_random();
    snprintf(addr,sz,"%s://nuts%04x%04x%04x%04x",scheme,(ulong)uVar3,(ulong)uVar4,uVar5,uVar6);
    return;
  }
  iVar2 = strncmp(scheme,"tcp",3);
  if ((iVar2 != 0) &&
     ((iVar2 = strncmp(scheme,"tls",3), iVar2 != 0 && (iVar2 = strncmp(scheme,"udp",3), iVar2 != 0))
     )) {
    iVar2 = strncmp(scheme,"ws",2);
    if (iVar2 == 0) {
      pcVar7 = strchr(scheme,0x36);
      pcVar8 = "127.0.0.1";
      if (pcVar7 != (char *)0x0) {
        pcVar8 = "[::1]";
      }
      uVar1 = nuts_next_port();
      uVar3 = nng_random();
      uVar4 = nng_random();
      uVar5 = nng_random();
      uVar6 = nng_random();
      snprintf(addr,sz,"%s://%s:%u/nuts%04x%04x%04x%04x",scheme,pcVar8,(ulong)uVar1,uVar3,uVar4,
               uVar5,uVar6);
      return;
    }
    iVar2 = strncmp(scheme,"ipc",3);
    if ((iVar2 != 0) && (iVar2 = strncmp(scheme,"unix",4), iVar2 != 0)) {
      nng_log_err("NUTS","Unknown scheme");
      abort();
    }
    local_40 = getenv("TMPDIR");
    if (((local_40 == (char *)0x0) && (local_40 = getenv("TEMP"), local_40 == (char *)0x0)) &&
       (local_40 = getenv("TMP"), local_40 == (char *)0x0)) {
      local_40 = "/tmp";
    }
    uVar3 = nng_random();
    uVar4 = nng_random();
    uVar5 = nng_random();
    uVar6 = nng_random();
    snprintf(addr,sz,"%s://%s/nuts%04x%04x%04x%04x",scheme,local_40,(ulong)uVar3,uVar4,uVar5,uVar6);
    return;
  }
  pcVar7 = strchr(scheme,0x36);
  pcVar8 = "127.0.0.1";
  if (pcVar7 != (char *)0x0) {
    pcVar8 = "[::1]";
  }
  uVar1 = nuts_next_port();
  snprintf(addr,sz,"%s://%s:%u",scheme,pcVar8,(ulong)uVar1);
  return;
}

Assistant:

void
nuts_scratch_addr(const char *scheme, size_t sz, char *addr)
{
	if ((strcmp(scheme, "inproc") == 0) ||
	    (strcmp(scheme, "abstract") == 0)) {
		(void) snprintf(addr, sz, "%s://nuts%04x%04x%04x%04x", scheme,
		    nng_random(), nng_random(), nng_random(), nng_random());
		return;
	}

	if ((strncmp(scheme, "tcp", 3) == 0) ||
	    (strncmp(scheme, "tls", 3) == 0) ||
	    (strncmp(scheme, "udp", 3) == 0)) {
		const char *ip =
		    strchr(scheme, '6') != NULL ? "[::1]" : "127.0.0.1";
		(void) snprintf(
		    addr, sz, "%s://%s:%u", scheme, ip, nuts_next_port());
		return;
	}

	if (strncmp(scheme, "ws", 2) == 0) {
		const char *ip =
		    strchr(scheme, '6') != NULL ? "[::1]" : "127.0.0.1";
		(void) snprintf(addr, sz, "%s://%s:%u/nuts%04x%04x%04x%04x",
		    scheme, ip, nuts_next_port(), nng_random(), nng_random(),
		    nng_random(), nng_random());
		return;
	}

	if ((strncmp(scheme, "ipc", 3) == 0) ||
	    (strncmp(scheme, "unix", 4) == 0)) {
#ifdef _WIN32
		// Windows doesn't place IPC names in the filesystem.
		(void) snprintf(addr, sz, "%s://nuts%04x%04x%04x%04x", scheme,
		    nng_random(), nng_random(), nng_random(), nng_random());
		return;
#else
		char *tmpdir;

		if (((tmpdir = getenv("TMPDIR")) == NULL) &&
		    ((tmpdir = getenv("TEMP")) == NULL) &&
		    ((tmpdir = getenv("TMP")) == NULL)) {
			tmpdir = "/tmp";
		}

		(void) snprintf(addr, sz, "%s://%s/nuts%04x%04x%04x%04x",
		    scheme, tmpdir, nng_random(), nng_random(), nng_random(),
		    nng_random());
		return;
#endif
	}

	// We should not be here.
	nng_log_err("NUTS", "Unknown scheme");
	abort();
}